

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O0

int lws_tls_client_confirm_peer_cert(lws *wsi,char *ebuf,int ebuf_len)

{
  uchar *buf;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  int n;
  char *sb;
  char *p;
  lws_context_per_thread *pt;
  int ebuf_len_local;
  char *ebuf_local;
  lws *wsi_local;
  
  buf = wsi->context->pt[(int)wsi->tsi].serv_buf;
  piVar2 = __errno_location();
  *piVar2 = 0;
  ERR_clear_error();
  uVar3 = SSL_get_verify_result((SSL *)(wsi->tls).ssl);
  iVar1 = (int)uVar3;
  _lws_log(0x10,"get_verify says %d\n",uVar3 & 0xffffffff);
  if (iVar1 == 0) {
    wsi_local._4_4_ = 0;
  }
  else if (((iVar1 == 0x12) || (iVar1 == 0x13)) && (((wsi->tls).use_ssl & 2) != 0)) {
    _lws_log(8,"accepting self-signed certificate\n");
    wsi_local._4_4_ = 0;
  }
  else if (((iVar1 == 9) || (iVar1 == 10)) && (((wsi->tls).use_ssl & 8) != 0)) {
    _lws_log(8,"accepting expired certificate\n");
    wsi_local._4_4_ = 0;
  }
  else if (iVar1 == 9) {
    _lws_log(8,"Cert is from the future... probably our clock... accepting...\n");
    wsi_local._4_4_ = 0;
  }
  else {
    pcVar4 = ERR_error_string((long)iVar1,(char *)buf);
    lws_snprintf(ebuf,(long)ebuf_len,"server\'s cert didn\'t look good, X509_V_ERR = %d: %s\n",
                 uVar3 & 0xffffffff,pcVar4);
    _lws_log(8,"%s\n",ebuf);
    lws_tls_err_describe_clear();
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_tls_client_confirm_peer_cert(struct lws *wsi, char *ebuf, int ebuf_len)
{
#if !defined(USE_WOLFSSL)
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	char *p = (char *)&pt->serv_buf[0];
	char *sb = p;
	int n;

	errno = 0;
	ERR_clear_error();
	n = SSL_get_verify_result(wsi->tls.ssl);

	lwsl_debug("get_verify says %d\n", n);

	if (n == X509_V_OK)
		return 0;

	if ((n == X509_V_ERR_DEPTH_ZERO_SELF_SIGNED_CERT ||
	     n == X509_V_ERR_SELF_SIGNED_CERT_IN_CHAIN) &&
	     (wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED)) {
		lwsl_info("accepting self-signed certificate\n");

		return 0;
	}
	if ((n == X509_V_ERR_CERT_NOT_YET_VALID ||
	     n == X509_V_ERR_CERT_HAS_EXPIRED) &&
	     (wsi->tls.use_ssl & LCCSCF_ALLOW_EXPIRED)) {
		lwsl_info("accepting expired certificate\n");
		return 0;
	}
	if (n == X509_V_ERR_CERT_NOT_YET_VALID) {
		lwsl_info("Cert is from the future... "
			    "probably our clock... accepting...\n");
		return 0;
	}
	lws_snprintf(ebuf, ebuf_len,
		"server's cert didn't look good, X509_V_ERR = %d: %s\n",
		 n, ERR_error_string(n, sb));
	lwsl_info("%s\n", ebuf);
	lws_tls_err_describe_clear();

	return -1;

#else /* USE_WOLFSSL */
	return 0;
#endif
}